

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O1

type jsoncons::detail::to_integer<signed_char,char>(char *s,size_t length,char *n)

{
  char cVar1;
  ulong uVar2;
  undefined8 uVar3;
  type tVar4;
  type tVar5;
  type tVar6;
  U u;
  undefined8 uStack_18;
  
  *n = '\0';
  if (length == 0) {
    tVar5._9_7_ = (undefined7)((ulong)n >> 8);
    tVar5.ec = 3;
    tVar5.ptr = s;
    return tVar5;
  }
  cVar1 = *s;
  uVar2 = (ulong)(cVar1 == '-');
  uStack_18 = s;
  tVar4 = to_integer<unsigned_char,char>(s + uVar2,length - uVar2,(uchar *)((long)&uStack_18 + 7));
  uVar3 = tVar4._8_8_;
  tVar6.ptr = tVar4.ptr;
  if (tVar4.ec == success) {
    if (cVar1 == '-') {
      uVar3 = CONCAT71(tVar4._9_7_,1);
      if (0x80 < uStack_18._7_1_) goto LAB_002da54d;
      uStack_18._7_1_ = -uStack_18._7_1_;
    }
    else if ((long)uStack_18 < 0) {
      uVar3 = CONCAT71(tVar4._9_7_,1);
      goto LAB_002da54d;
    }
    *n = uStack_18._7_1_;
    uVar3 = 0;
  }
LAB_002da54d:
  tVar6._8_8_ = uVar3;
  return tVar6;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
to_integer(const CharT* s, std::size_t length, T& n)
{
    n = 0;

    if (length == 0)
    {
        return to_integer_result<T,CharT>(s, to_integer_errc::invalid_number);
    }

    bool is_negative = *s == '-' ? true : false;
    if (is_negative)
    {
        ++s;
        --length;
    }

    using U = typename ext_traits::make_unsigned<T>::type;

    U u;
    auto ru = to_integer(s, length, u);
    if (ru.ec != to_integer_errc())
    {
        return to_integer_result<T,CharT>(ru.ptr, ru.ec);
    }
    if (is_negative)
    {
        if (u > static_cast<U>(-((ext_traits::integer_limits<T>::lowest)()+T(1))) + U(1))
        {
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc::overflow);
        }
        else
        {
            n = static_cast<T>(U(0) - u);
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc());
        }
    }
    else
    {
        if (u > static_cast<U>((ext_traits::integer_limits<T>::max)()))
        {
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc::overflow);
        }
        else
        {
            n = static_cast<T>(u);
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc());
        }
    }
}